

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

void __thiscall polyscope::TransformationGizmo::prepare(TransformationGizmo *this)

{
  long *plVar1;
  element_type *peVar2;
  Engine *this_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  center;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  components_1;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors_1;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  bases;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vectors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  components;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  coords;
  tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  *in_stack_fffffffffffff7a8;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffff7b0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff7b8;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff7c0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff7c8;
  allocator_type *in_stack_fffffffffffff7d8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff7e0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7e8;
  string *local_7b8;
  TransformationGizmo *in_stack_fffffffffffff868;
  string *this_01;
  TransformationGizmo *in_stack_fffffffffffff8a8;
  ShaderProgram *program;
  string *local_700;
  allocator local_611;
  string local_610 [36];
  vec<3,float,(glm::qualifier)0> local_5ec [12];
  vec<3,float,(glm::qualifier)0> *local_5e0;
  undefined8 local_5d8;
  undefined1 local_5d0 [31];
  allocator local_5b1;
  string local_5b0 [37];
  undefined1 local_58b;
  allocator local_58a;
  allocator local_589;
  string *local_588;
  string local_580 [32];
  string local_560 [32];
  string *local_540;
  undefined8 local_538;
  undefined1 local_530 [31];
  allocator local_511;
  string local_510 [32];
  undefined1 local_4f0 [23];
  allocator local_4d9;
  string local_4d8 [39];
  undefined1 local_4b1 [40];
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [160];
  undefined1 local_398 [24];
  undefined1 local_380 [24];
  undefined1 local_368 [24];
  undefined1 local_350 [27];
  undefined1 local_335;
  allocator local_334;
  allocator local_333;
  allocator local_332;
  allocator local_331;
  string *local_330;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [31];
  allocator local_279;
  string local_278 [32];
  undefined1 local_258 [23];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [192];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [16];
  undefined8 local_58;
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"TRANSFORMATION_GIZMO_ROT",&local_39);
  local_68 = (undefined1  [16])0x0;
  local_58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3810c2);
  (**(code **)(*plVar1 + 0x118))(local_18,plVar1,local_38,local_68,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x381127);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x38115b);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x381168);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x381175);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)0x381182);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x38118f);
  triplePlaneCoords(in_stack_fffffffffffff8a8);
  std::
  tie<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            (in_stack_fffffffffffff7c8,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff7b0,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff7a8);
  std::
  tuple<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::operator=((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&>
               *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::
  tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::~tuple((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
            *)0x38120d);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x381221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"a_position",&local_1a1);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_1a0,local_80,0,0,0xffffffff);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3812bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"a_normal",&local_1c9);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_1c8,local_98,0,0,0xffffffff);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x381357);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"a_color",&local_1f1);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_1f0,local_b0,0,0,0xffffffff);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3813f2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"a_texcoord",&local_219);
  (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_218,local_c8,0,0,0xffffffff);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38148a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"a_component",&local_241);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_240,local_e0,0,0,0xffffffff);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"RAYCAST_VECTOR",&local_279);
  local_335 = 1;
  local_330 = local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"VECTOR_PROPAGATE_COLOR",&local_331);
  local_330 = local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"TRANSFORMATION_GIZMO_VEC",&local_332);
  local_330 = local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"SHADE_COLOR",&local_333);
  local_330 = local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"LIGHT_MATCAP",&local_334);
  local_335 = 0;
  local_2a8 = local_328;
  local_2a0 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x381704);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7e8,
           (allocator_type *)in_stack_fffffffffffff7d8);
  (**(code **)(*plVar1 + 0x118))(local_258,plVar1,local_278,local_298,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x381788);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3817a2);
  local_700 = (string *)&local_2a8;
  do {
    local_700 = local_700 + -0x20;
    std::__cxx11::string::~string(local_700);
  } while (local_700 != local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_334);
  std::allocator<char>::~allocator((allocator<char> *)&local_333);
  std::allocator<char>::~allocator((allocator<char> *)&local_332);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x381851);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x38185e);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x38186b);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x381878);
  tripleArrowCoords(in_stack_fffffffffffff868);
  std::
  tie<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            (in_stack_fffffffffffff7c8,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff7b0);
  std::
  tuple<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::operator=((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_&>
               *)in_stack_fffffffffffff7b0,
              (tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *)in_stack_fffffffffffff7a8);
  std::
  tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::~tuple((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
            *)0x3818ee);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x381902);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"a_vector",&local_439);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_438,local_350,0,0,0xffffffff);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38199d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"a_position",&local_461);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_460,local_368,0,0,0xffffffff);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  this_00 = (Engine *)
            std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x381a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"a_color",&local_489);
  (*this_00->_vptr_Engine[0x10])(this_00,local_488,local_380,0,0,0xffffffff);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x381ad3);
  program = (ShaderProgram *)local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_4b1 + 1),"a_component",(allocator *)program);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_4b1 + 1,local_398,0,0,0xffffffff);
  std::__cxx11::string::~string((string *)(local_4b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b1);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffff7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d8,"wax",&local_4d9);
  render::Engine::setMaterial(this_00,program,(string *)peVar2);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"RAYCAST_SPHERE",&local_511);
  local_58b = 1;
  this_01 = local_580;
  local_588 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_01,"SHADE_BASECOLOR",&local_589);
  local_588 = local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"LIGHT_MATCAP",&local_58a);
  local_58b = 0;
  local_540 = local_580;
  local_538 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x381d44);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7e8,
           (allocator_type *)in_stack_fffffffffffff7d8);
  (**(code **)(*plVar1 + 0x118))(local_4f0,plVar1,local_510,local_530,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7b0,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffff7a8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x381dc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x381de2);
  local_7b8 = (string *)&local_540;
  do {
    local_7b8 = local_7b8 + -0x20;
    std::__cxx11::string::~string(local_7b8);
  } while (local_7b8 != local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_58a);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffff7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"wax",&local_5b1);
  render::Engine::setMaterial(this_00,program,(string *)peVar2);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_5ec,0.0,0.0,0.0);
  local_5d8 = 1;
  local_5e0 = local_5ec;
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x381f45);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(in_stack_fffffffffffff7e0,
           (initializer_list<glm::vec<3,_float,_(glm::qualifier)0>_>)in_stack_fffffffffffff7e8,
           in_stack_fffffffffffff7d8);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x381f76);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x381f8a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"a_position",&local_611);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_610,local_5d0,0,0,0xffffffff);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffff7c0);
  return;
}

Assistant:

void TransformationGizmo::prepare() {

  { // The rotation rings, drawn via textured quads
    ringProgram =
        render::engine->requestShader("TRANSFORMATION_GIZMO_ROT", {}, render::ShaderReplacementDefaults::Process);

    std::vector<glm::vec3> coords;
    std::vector<glm::vec3> normals;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec2> texcoords;
    std::vector<glm::vec3> components;
    std::tie(coords, normals, colors, texcoords, components) = triplePlaneCoords();

    ringProgram->setAttribute("a_position", coords);
    ringProgram->setAttribute("a_normal", normals);
    ringProgram->setAttribute("a_color", colors);
    ringProgram->setAttribute("a_texcoord", texcoords);
    ringProgram->setAttribute("a_component", components);

    // render::engine->setMaterial(*ringProgram, "wax");
  }

  { // Translation arrows
    arrowProgram = render::engine->requestShader(
        "RAYCAST_VECTOR", {"VECTOR_PROPAGATE_COLOR", "TRANSFORMATION_GIZMO_VEC", "SHADE_COLOR", "LIGHT_MATCAP"},
        render::ShaderReplacementDefaults::Process);

    std::vector<glm::vec3> vectors;
    std::vector<glm::vec3> bases;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec3> components;
    std::tie(vectors, bases, colors, components) = tripleArrowCoords();

    arrowProgram->setAttribute("a_vector", vectors);
    arrowProgram->setAttribute("a_position", bases);
    arrowProgram->setAttribute("a_color", colors);
    arrowProgram->setAttribute("a_component", components);

    render::engine->setMaterial(*arrowProgram, "wax");
  }

  { // Scale sphere
    sphereProgram = render::engine->requestShader("RAYCAST_SPHERE", {"SHADE_BASECOLOR", "LIGHT_MATCAP"},
                                                  render::ShaderReplacementDefaults::Process);
    render::engine->setMaterial(*sphereProgram, "wax");

    std::vector<glm::vec3> center = {glm::vec3(0., 0., 0.)};
    sphereProgram->setAttribute("a_position", center);
  }
}